

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O1

FrameOpResult __thiscall QRhi::endOffscreenFrame(QRhi *this,EndFrameFlags flags)

{
  QRhiImplementation *pQVar1;
  ulong uVar2;
  FrameOpResult FVar3;
  Span *in_RDX;
  Span *extraout_RDX;
  Span *extraout_RDX_00;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator begin;
  undefined8 local_48;
  undefined8 uStack_40;
  Data *local_30;
  ulong local_28;
  size_t local_20;
  
  local_20 = *(size_t *)(in_FS_OFFSET + 0x28);
  if (this->d->inFrame == false) {
    endOffscreenFrame();
    in_RDX = extraout_RDX_00;
  }
  pQVar1 = this->d;
  FVar3 = FrameOpSuccess;
  if (pQVar1->inFrame == true) {
    FVar3 = (*pQVar1->_vptr_QRhiImplementation[0x12])
                      (pQVar1,(ulong)(uint)flags.super_QFlagsStorageHelper<QRhi::EndFrameFlag,_4>.
                                           super_QFlagsStorage<QRhi::EndFrameFlag>.i);
    in_RDX = extraout_RDX;
  }
  pQVar1 = this->d;
  pQVar1->inFrame = false;
  local_30 = (pQVar1->pendingDeleteResources).q_hash.d;
  if (local_30 == (Data *)0x0) {
    local_30 = (Data *)0x0;
  }
  else {
    in_RDX = local_30->spans;
    if (in_RDX->offsets[0] == 0xff) {
      uVar2 = 1;
      do {
        local_28 = uVar2;
        if (local_30->numBuckets == local_28) {
          local_30 = (Data *)0x0;
          local_28 = 0;
          break;
        }
        uVar2 = local_28 + 1;
      } while (in_RDX[local_28 >> 7].offsets[(uint)local_28 & 0x7f] == 0xff);
      goto LAB_00458a9b;
    }
  }
  local_28 = 0;
LAB_00458a9b:
  local_48 = 0;
  uStack_40 = 0;
  end.i.i.bucket = local_28;
  end.i.i.d = (Data<QHashPrivate::Node<QRhiResource_*,_QHashDummyValue>_> *)in_RDX;
  begin.i.i.bucket = (size_t)&local_48;
  begin.i.i.d = (Data<QHashPrivate::Node<QRhiResource_*,_QHashDummyValue>_> *)&local_30;
  qDeleteAll<QSet<QRhiResource*>::const_iterator>(begin,end);
  QHash<QRhiResource_*,_QHashDummyValue>::clear(&(this->d->pendingDeleteResources).q_hash);
  if (*(size_t *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return FVar3;
}

Assistant:

QRhi::FrameOpResult QRhi::endOffscreenFrame(EndFrameFlags flags)
{
    if (!d->inFrame)
        qWarning("Attempted to call endOffscreenFrame() without an active frame; ignored");

    QRhi::FrameOpResult r = d->inFrame ? d->endOffscreenFrame(flags) : FrameOpSuccess;
    d->inFrame = false;
    qDeleteAll(d->pendingDeleteResources);
    d->pendingDeleteResources.clear();

    return r;
}